

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgmtf(fitsfile *infptr,fitsfile *outfptr,long member,int tfopt,int *status)

{
  int iVar1;
  fitsfile *mfptr;
  fitsfile *local_38;
  
  local_38 = (fitsfile *)0x0;
  iVar1 = *status;
  if (iVar1 == 0) {
    if ((tfopt == 0) || (tfopt == 3)) {
      iVar1 = ffgmop(infptr,member,&local_38,status);
      *status = iVar1;
      iVar1 = ffgtam(outfptr,local_38,0,status);
      *status = iVar1;
      iVar1 = ffclos(local_38,status);
      *status = iVar1;
      if (tfopt == 3) {
        iVar1 = ffgmrm(infptr,member,1,status);
        *status = iVar1;
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value specified for the tfopt parameter (ffgmtf)");
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgmtf(fitsfile *infptr,   /* FITS file pointer to source grouping table */
	   fitsfile *outfptr,  /* FITS file pointer to target grouping table */
	   long      member,   /* member ID within source grouping table     */
	   int       tfopt,    /* code specifying transfer opts:
				  OPT_MCP_ADD (0) ==> copy member to dest.
				  OPT_MCP_MOV (3) ==> move member to dest.   */
	   int      *status)   /* return status code                         */

/*
  transfer a group member from one grouping table to another. The source
  grouping table must be the CHDU of the fitsfile pointed to by infptr, and 
  the destination grouping table must be the CHDU of the fitsfile to by 
  outfptr. If the tfopt parameter is OPT_MCP_ADD then the member is made a 
  member of the target group and remains a member of the source group. If
  the tfopt parameter is OPT_MCP_MOV then the member is deleted from the 
  source group after the transfer to the destination group. The member to be
  transfered is identified by its row number within the source grouping table.
*/

{
  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  if(tfopt != OPT_MCP_MOV && tfopt != OPT_MCP_ADD)
    {
      *status = BAD_OPTION;
      ffpmsg("Invalid value specified for the tfopt parameter (ffgmtf)");
    }
  else
    {
      /* open the member of infptr to be transfered */

      *status = fits_open_member(infptr,member,&mfptr,status);
      
      /* add the member to the outfptr grouping table */
      
      *status = fits_add_group_member(outfptr,mfptr,0,status);
      
      /* close the member HDU */
      
      *status = fits_close_file(mfptr,status);
      
      /* 
	 if the tfopt is "move member" then remove it from the infptr 
	 grouping table
      */

      if(tfopt == OPT_MCP_MOV)
	*status = fits_remove_member(infptr,member,OPT_RM_ENTRY,status);
    }
  
  return(*status);
}